

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

RGB __thiscall pbrt::MIPMap::Lookup<pbrt::RGB>(MIPMap *this,Point2f *st,Vector2f dst0,Vector2f dst1)

{
  undefined8 uVar1;
  size_t sVar2;
  int level;
  float fVar3;
  Float FVar4;
  undefined1 auVar5 [16];
  float fVar9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  Tuple2<pbrt::Vector2,_float> dst1_00;
  RGB RVar14;
  RGB RVar15;
  RGB RVar16;
  initializer_list<float> __l;
  Vector2f local_68;
  float local_48;
  float fStack_44;
  undefined1 local_28 [16];
  
  auVar12._8_56_ = in_register_00001248;
  auVar12._0_8_ = dst1.super_Tuple2<pbrt::Vector2,_float>;
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = dst0.super_Tuple2<pbrt::Vector2,_float>;
  auVar5 = auVar8._0_16_;
  auVar10 = auVar12._0_16_;
  if ((this->options).filter == EWA) {
    auVar6._0_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.x *
                   dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar6._4_4_ = dst0.super_Tuple2<pbrt::Vector2,_float>.y *
                   dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar6._8_4_ = in_register_00001208._0_4_ * in_register_00001208._0_4_;
    auVar6._12_4_ = in_register_00001208._4_4_ * in_register_00001208._4_4_;
    auVar13._0_4_ =
         dst1.super_Tuple2<pbrt::Vector2,_float>.x * dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar13._4_4_ =
         dst1.super_Tuple2<pbrt::Vector2,_float>.y * dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar13._8_4_ = in_register_00001248._0_4_ * in_register_00001248._0_4_;
    auVar13._12_4_ = in_register_00001248._4_4_ * in_register_00001248._4_4_;
    auVar6 = vhaddps_avx(auVar6,auVar6);
    auVar13 = vhaddps_avx(auVar13,auVar13);
    auVar11 = auVar5;
    if (auVar13._0_4_ <= auVar6._0_4_) {
      auVar11 = auVar10;
      auVar10 = auVar5;
    }
    dst1_00 = auVar11._0_8_;
    auVar5 = vinsertps_avx(auVar11,auVar10,0x1c);
    auVar6 = vinsertps_avx(auVar10,auVar11,0x4c);
    auVar7._0_4_ = auVar5._0_4_ * auVar5._0_4_ + auVar6._0_4_ * auVar6._0_4_;
    auVar7._4_4_ = auVar5._4_4_ * auVar5._4_4_ + auVar6._4_4_ * auVar6._4_4_;
    auVar7._8_4_ = auVar5._8_4_ * auVar5._8_4_ + auVar6._8_4_ * auVar6._8_4_;
    auVar7._12_4_ = auVar5._12_4_ * auVar5._12_4_ + auVar6._12_4_ * auVar6._12_4_;
    auVar6 = vsqrtps_avx(auVar7);
    fVar3 = auVar6._0_4_;
    fVar9 = fVar3 * (this->options).maxAnisotropy;
    auVar5 = vinsertps_avx(auVar6,ZEXT416((uint)fVar9),0x1d);
    uVar1 = vcmpps_avx512vl(auVar5,auVar6,1);
    if ((~(ushort)uVar1 & 3) == 0) {
      auVar5 = vmovshdup_avx(auVar6);
      fVar9 = auVar5._0_4_ / fVar9;
      fVar3 = fVar3 * fVar9;
      dst1_00.x = auVar11._0_4_ * fVar9;
      dst1_00.y = auVar11._4_4_ * fVar9;
    }
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      RVar14 = Bilerp<pbrt::RGB>(this,0,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
      return RVar14;
    }
    sVar2 = (this->pyramid).nStored;
    FVar4 = Log2(fVar3);
    auVar6 = vmaxss_avx(ZEXT416((uint)(FVar4 + (float)((int)sVar2 + -1))),ZEXT416(0));
    auVar5 = vroundss_avx(auVar6,auVar6,9);
    level = (int)auVar5._0_4_;
    auVar11._0_4_ = (int)auVar5._0_4_;
    auVar11._4_4_ = (int)auVar5._4_4_;
    auVar11._8_4_ = (int)auVar5._8_4_;
    auVar11._12_4_ = (int)auVar5._12_4_;
    auVar5 = vcvtdq2ps_avx(auVar11);
    fVar9 = auVar6._0_4_ - auVar5._0_4_;
    fVar3 = 1.0 - fVar9;
    local_68.super_Tuple2<pbrt::Vector2,_float> = auVar10._0_8_;
    RVar15 = EWA<pbrt::RGB>(this,level,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_68,
                            (Vector2f)dst1_00);
    RVar16 = EWA<pbrt::RGB>(this,level + 1,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_68,
                            (Vector2f)dst1_00);
    local_48 = RVar15.r;
    fStack_44 = RVar15.g;
    RVar14.g = RVar16.g * fVar9 + fVar3 * fStack_44;
    RVar14.r = RVar16.r * fVar9 + fVar3 * local_48;
    RVar14.b = RVar16.b * fVar9 + RVar15.b * fVar3;
  }
  else {
    auVar10 = vmovlhps_avx(auVar5,auVar10);
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    local_28 = vandps_avx512vl(auVar10,auVar5);
    __l._M_len = 4;
    __l._M_array = (iterator)local_28;
    fVar9 = std::max<float>(__l);
    RVar14 = Lookup<pbrt::RGB>(this,st,fVar9 + fVar9);
  }
  return RVar14;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        Float width = std::max(
            {std::abs(dst0[0]), std::abs(dst0[1]), std::abs(dst1[0]), std::abs(dst1[1])});
        return Lookup<T>(st, 2 * width);
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0);
    Float minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    // TODO: just do return EWA<T>(ilog, st, dst0, dst1);
    // TODO: also, when scaling camera ray differentials, just do e.g.
    // 1 / std::min(sqrtSamplesPerPixel, 8);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}